

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::RemoveLast(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  MapFieldBase *this_00;
  FieldDescriptor *in_RDX;
  Reflection *in_RDI;
  char *in_stack_00000058;
  char *in_stack_00000060;
  FieldDescriptor *in_stack_00000068;
  Descriptor *in_stack_00000070;
  int in_stack_0000008c;
  ExtensionSet *in_stack_00000090;
  Message *in_stack_ffffffffffffffc8;
  Reflection *in_stack_ffffffffffffffd0;
  Message *in_stack_ffffffffffffffd8;
  
  pDVar4 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar4 != in_RDI->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058);
  }
  LVar2 = FieldDescriptor::label(in_RDX);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058);
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    MutableExtensionSet(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    FieldDescriptor::number(in_RDX);
    internal::ExtensionSet::RemoveLast(in_stack_00000090,in_stack_0000008c);
  }
  else {
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x421579);
    this_00 = (MapFieldBase *)(ulong)(CVar3 - CPPTYPE_INT32);
    switch(this_00) {
    case (MapFieldBase *)0x0:
      MutableRaw<google::protobuf::RepeatedField<int>>
                (in_RDI,in_stack_ffffffffffffffd8,(FieldDescriptor *)this_00);
      RepeatedField<int>::RemoveLast((RepeatedField<int> *)this);
      break;
    case (MapFieldBase *)0x1:
      MutableRaw<google::protobuf::RepeatedField<long>>
                (in_RDI,in_stack_ffffffffffffffd8,(FieldDescriptor *)this_00);
      RepeatedField<long>::RemoveLast((RepeatedField<long> *)this);
      break;
    case (MapFieldBase *)0x2:
      MutableRaw<google::protobuf::RepeatedField<unsigned_int>>
                (in_RDI,in_stack_ffffffffffffffd8,(FieldDescriptor *)this_00);
      RepeatedField<unsigned_int>::RemoveLast((RepeatedField<unsigned_int> *)this);
      break;
    case (MapFieldBase *)0x3:
      MutableRaw<google::protobuf::RepeatedField<unsigned_long>>
                (in_RDI,in_stack_ffffffffffffffd8,(FieldDescriptor *)this_00);
      RepeatedField<unsigned_long>::RemoveLast((RepeatedField<unsigned_long> *)this);
      break;
    case (MapFieldBase *)0x4:
      MutableRaw<google::protobuf::RepeatedField<double>>
                (in_RDI,in_stack_ffffffffffffffd8,(FieldDescriptor *)this_00);
      RepeatedField<double>::RemoveLast((RepeatedField<double> *)this);
      break;
    case (MapFieldBase *)0x5:
      MutableRaw<google::protobuf::RepeatedField<float>>
                (in_RDI,in_stack_ffffffffffffffd8,(FieldDescriptor *)this_00);
      RepeatedField<float>::RemoveLast((RepeatedField<float> *)this);
      break;
    case (MapFieldBase *)0x6:
      MutableRaw<google::protobuf::RepeatedField<bool>>
                (in_RDI,in_stack_ffffffffffffffd8,(FieldDescriptor *)this_00);
      RepeatedField<bool>::RemoveLast((RepeatedField<bool> *)this);
      break;
    case (MapFieldBase *)0x7:
      MutableRaw<google::protobuf::RepeatedField<int>>
                (in_RDI,in_stack_ffffffffffffffd8,(FieldDescriptor *)this_00);
      RepeatedField<int>::RemoveLast((RepeatedField<int> *)this);
      break;
    case (MapFieldBase *)0x8:
      FieldDescriptor::options(in_RDX);
      FieldOptions::ctype((FieldOptions *)0x4216ba);
      MutableRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                (in_RDI,in_stack_ffffffffffffffd8,(FieldDescriptor *)this_00);
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::RemoveLast((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x4216de);
      break;
    case (MapFieldBase *)0x9:
      bVar1 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x4216ea);
      if (bVar1) {
        MutableRaw<google::protobuf::internal::MapFieldBase>
                  (in_RDI,in_stack_ffffffffffffffd8,(FieldDescriptor *)this_00);
        internal::MapFieldBase::MutableRepeatedField(this_00);
        internal::RepeatedPtrFieldBase::
        RemoveLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                  ((RepeatedPtrFieldBase *)this);
      }
      else {
        MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                  (in_RDI,in_stack_ffffffffffffffd8,(FieldDescriptor *)this_00);
        internal::RepeatedPtrFieldBase::
        RemoveLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                  ((RepeatedPtrFieldBase *)this);
      }
    }
  }
  return;
}

Assistant:

void Reflection::RemoveLast(Message* message,
                            const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(RemoveLast);
  USAGE_CHECK_REPEATED(RemoveLast);

  if (field->is_extension()) {
    MutableExtensionSet(message)->RemoveLast(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                             \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field)->RemoveLast(); \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<std::string> >(message, field)
                ->RemoveLast();
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->RemoveLast<GenericTypeHandler<Message> >();
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->RemoveLast<GenericTypeHandler<Message> >();
        }
        break;
    }
  }
}